

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O1

void nn_excl_term(nn_excl *self)

{
  if (self->pipe == (nn_pipe *)0x0) {
    if (self->inpipe == (nn_pipe *)0x0) {
      if (self->outpipe == (nn_pipe *)0x0) {
        return;
      }
      goto LAB_00157344;
    }
  }
  else {
    nn_excl_term_cold_1();
  }
  nn_excl_term_cold_2();
LAB_00157344:
  nn_excl_term_cold_3();
}

Assistant:

void nn_excl_term (struct nn_excl *self)
{
    nn_assert (!self->pipe);
    nn_assert (!self->inpipe);
    nn_assert (!self->outpipe);
}